

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O1

string * __thiscall
cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
          (string *__return_storage_ptr__,cmOutputConverter *this,string_view source,
          OutputFormat output)

{
  string_view str;
  string_view str_00;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,source._M_str,source._M_str + source._M_len);
  if (output < RESPONSE) {
    ConvertDirectorySeparatorsForShell_abi_cxx11_(&local_50,this,source);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    str._M_str = (__return_storage_ptr__->_M_dataplus)._M_p;
    str._M_len = __return_storage_ptr__->_M_string_length;
    EscapeForShell_abi_cxx11_
              (&local_50,this,str,true,false,output == WATCOMQUOTE,output == NINJAMULTI,false);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    if (output != RESPONSE) {
      return __return_storage_ptr__;
    }
    str_00._M_str = (__return_storage_ptr__->_M_dataplus)._M_p;
    str_00._M_len = __return_storage_ptr__->_M_string_length;
    EscapeForShell_abi_cxx11_(&local_50,this,str_00,false,false,false,false,true);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::ConvertToOutputFormat(cm::string_view source,
                                                     OutputFormat output) const
{
  std::string result(source);
  // Convert it to an output path.
  if (output == SHELL || output == WATCOMQUOTE || output == NINJAMULTI) {
    result = this->ConvertDirectorySeparatorsForShell(source);
    result = this->EscapeForShell(result, true, false, output == WATCOMQUOTE,
                                  output == NINJAMULTI);
  } else if (output == RESPONSE) {
    result = this->EscapeForShell(result, false, false, false, false, true);
  }
  return result;
}